

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CMU462::Viewer::showError(string *errorText,bool isFatal)

{
  ostream *poVar1;
  byte in_SIL;
  string *in_RDI;
  
  showingError = 1;
  errorDismissed = 0;
  std::__cxx11::string::operator=((string *)errorMessage_abi_cxx11_,in_RDI);
  errorFatal = in_SIL & 1;
  while (((errorDismissed ^ 0xff) & 1) != 0) {
    update();
  }
  if ((in_SIL & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"FATAL ERROR: ");
    poVar1 = std::operator<<(poVar1,in_RDI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  showingError = 0;
  return;
}

Assistant:

void Viewer::showError(std::string errorText, bool isFatal)
{

    // Set the error
    showingError = true;
    errorDismissed = false;
    errorMessage = errorText;
    errorFatal = isFatal;

    // Continue poll/draw loop so we redraw the screen and continue user input
    while(!errorDismissed) {
        Viewer::update();
    }

    // Panic quit if the error was fatal
    if(isFatal) {
        cerr << "FATAL ERROR: " << errorText << endl;
        exit(EXIT_FAILURE);
    }

    showingError = false;
}